

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_atomic(CompilerHLSL *this,uint32_t *ops,uint32_t length,Op op)

{
  undefined4 uVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  SPIRType *pSVar4;
  mapped_type *ts_5;
  int32_t *ts_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4;
  string *ts_00;
  string *ts_4_00;
  uint32_t id_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  bool local_319;
  string local_318 [32];
  undefined1 local_2f8 [8];
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [32];
  undefined1 local_298 [44];
  BaseType expr_type;
  SPIRAccessChain *chain_1;
  SPIRType *data_type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  SPIRType *local_220;
  SPIRType *type;
  char local_210;
  uint32_t local_208;
  uint32_t local_204;
  uint32_t id;
  uint32_t result_type;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [40];
  mapped_type *tmp_id;
  SPIRAccessChain *chain;
  SPIRType *data_type;
  string local_140 [32];
  undefined1 local_120 [70];
  char local_da;
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [67];
  byte local_75;
  bool is_atomic_store;
  undefined1 local_68 [40];
  string value_expr;
  char *local_28;
  char *atomic_op;
  Op op_local;
  uint32_t length_local;
  uint32_t *ops_local;
  CompilerHLSL *this_local;
  
  local_28 = (char *)0x0;
  atomic_op._0_4_ = op;
  atomic_op._4_4_ = length;
  _op_local = (TypedID<(spirv_cross::Types)0> *)ops;
  ops_local = (uint32_t *)this;
  ::std::__cxx11::string::string((string *)(local_68 + 0x20));
  id_00 = (uint32_t)this;
  if (((((Op)atomic_op != OpAtomicIDecrement) && ((Op)atomic_op != OpAtomicIIncrement)) &&
      ((Op)atomic_op != OpAtomicLoad)) && ((Op)atomic_op != OpAtomicStore)) {
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_68,id_00,
               SUB41(_op_local[(ulong)((Op)atomic_op == OpAtomicCompareExchange) + 5].id,0));
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)local_68);
    ::std::__cxx11::string::~string((string *)local_68);
  }
  local_75 = 0;
  switch((Op)atomic_op) {
  case OpAtomicLoad:
    local_28 = "InterlockedAdd";
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),"0");
    break;
  case OpAtomicStore:
    local_28 = "InterlockedExchange";
    local_75 = 1;
    break;
  case OpAtomicExchange:
    local_28 = "InterlockedExchange";
    break;
  case OpAtomicCompareExchange:
    if (atomic_op._4_4_ < 8) {
      local_da = '\x01';
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d8,"Not enough data for opcode.",&local_d9);
      CompilerError::CompilerError(pCVar3,(string *)local_d8);
      local_da = '\0';
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_28 = "InterlockedCompareExchange";
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_120,id_00,SUB41(_op_local[7].id,0))
    ;
    join<std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
              ((spirv_cross *)(local_120 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x20));
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)(local_120 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_120 + 0x20));
    ::std::__cxx11::string::~string((string *)local_120);
    break;
  default:
    data_type._6_1_ = 1;
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_140,"Unknown atomic opcode.",(allocator *)((long)&data_type + 7));
    CompilerError::CompilerError(pCVar3,(string *)local_140);
    data_type._6_1_ = 0;
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case OpAtomicIIncrement:
    local_28 = "InterlockedAdd";
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),"1");
    break;
  case OpAtomicIDecrement:
    local_28 = "InterlockedAdd";
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),"-1");
    break;
  case OpAtomicIAdd:
    local_28 = "InterlockedAdd";
    break;
  case OpAtomicISub:
    local_28 = "InterlockedAdd";
    CompilerGLSL::enclose_expression((CompilerGLSL *)local_b8,(string *)this);
    join<char_const(&)[2],std::__cxx11::string>
              ((spirv_cross *)(local_b8 + 0x20),(char (*) [2])0x4df0e5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)(local_b8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_b8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_b8);
    break;
  case OpAtomicSMin:
  case OpAtomicUMin:
    local_28 = "InterlockedMin";
    break;
  case OpAtomicSMax:
  case OpAtomicUMax:
    local_28 = "InterlockedMax";
    break;
  case OpAtomicAnd:
    local_28 = "InterlockedAnd";
    break;
  case OpAtomicOr:
    local_28 = "InterlockedOr";
    break;
  case OpAtomicXor:
    local_28 = "InterlockedXor";
  }
  if ((local_75 & 1) == 0) {
    local_204 = _op_local->id;
    local_208 = _op_local[1].id;
    pVar5 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&_op_local[1].id)
    ;
    type = (SPIRType *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_210 = pVar5.second;
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_204);
    local_220 = pSVar4;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&data_type_1,this,(ulong)local_208,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
              (local_240,this,pSVar4,&data_type_1,0);
    CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_240,(char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_240);
    ::std::__cxx11::string::~string((string *)&data_type_1);
    chain_1 = (SPIRAccessChain *)Compiler::expression_type((Compiler *)this,_op_local[2].id);
    register0x00000000 =
         Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,_op_local[2].id);
    if (((int)(chain_1->implied_read_expressions).buffer_capacity == 0xb) ||
       (register0x00000000 == (SPIRAccessChain *)0x0)) {
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_298,id_00,SUB41(_op_local[2].id,0));
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_2b8,this,(ulong)local_208,1);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&local_28,(char (*) [2])0x4f3f9c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                 (char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68 + 0x20),(char (*) [3])0x4f06f8,local_2b8,(char (*) [3])0x4d9ce1);
      ::std::__cxx11::string::~string((string *)local_2b8);
      ::std::__cxx11::string::~string((string *)local_298);
      local_298._36_4_ = *(undefined4 *)&(chain_1->super_IVariant).field_0xc;
    }
    else {
      local_298._36_4_ = 8;
      ts_00 = &register0x00000000->base;
      ts_4_00 = &register0x00000000->dynamic_index;
      ts_5_00 = &register0x00000000->static_index;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_2d8,this,(ulong)local_208,1);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,ts_00,(char (*) [2])0x4dfd16,&local_28,
                 (char (*) [2])0x4f3f9c,ts_4_00,ts_5_00,(char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68 + 0x20),(char (*) [3])0x4f06f8,local_2d8,(char (*) [3])0x4d9ce1);
      ::std::__cxx11::string::~string((string *)local_2d8);
    }
    pSVar4 = local_220;
    uVar1 = local_298._36_4_;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_318,this,(ulong)local_208,1);
    CompilerGLSL::bitcast_expression
              ((CompilerGLSL *)local_2f8,(SPIRType *)this,(BaseType)pSVar4,
               (string *)(ulong)(uint)uVar1);
    ::std::__cxx11::string::~string(local_318);
    local_319 = true;
    Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
              ((Compiler *)this,local_208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
               &local_204,&local_319);
    ::std::__cxx11::string::~string((string *)local_2f8);
  }
  else {
    chain = (SPIRAccessChain *)Compiler::expression_type((Compiler *)this,_op_local->id);
    tmp_id = (mapped_type *)
             Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,_op_local->id);
    local_180._32_8_ =
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::operator[](&(this->super_CompilerGLSL).extra_sub_expressions,&_op_local->id);
    if (((TypedID<(spirv_cross::Types)0> *)local_180._32_8_)->id == 0) {
      uVar2 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *(uint32_t *)local_180._32_8_ = uVar2;
      pSVar4 = Compiler::get_pointee_type((Compiler *)this,(SPIRType *)chain);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).self);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,uVar2,*(uint32_t *)local_180._32_8_);
    }
    if (((int)(chain->implied_read_expressions).buffer_capacity == 0xb) ||
       (tmp_id == (mapped_type *)0x0)) {
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_180,id_00,SUB41(_op_local->id,0))
      ;
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_1a0,id_00,SUB41(_op_local[3].id,0));
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_1c0,id_00,SUB41(*(uint32_t *)local_180._32_8_,0));
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&local_28,(char (*) [2])0x4f3f9c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                 (char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 (char (*) [3])0x4d9ce1);
      ::std::__cxx11::string::~string((string *)local_1c0);
      ::std::__cxx11::string::~string((string *)local_1a0);
      ::std::__cxx11::string::~string((string *)local_180);
    }
    else {
      ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(tmp_id + 6);
      ts_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(tmp_id + 0xe);
      ts_5 = tmp_id + 0x16;
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_1e0,id_00,SUB41(_op_local[3].id,0));
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)&id,id_00,SUB41(*(uint32_t *)local_180._32_8_,0));
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,ts,(char (*) [2])0x4dfd16,&local_28,
                 (char (*) [2])0x4f3f9c,ts_4,(int *)ts_5,(char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 (char (*) [3])0x4f06f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                 (char (*) [3])0x4d9ce1);
      ::std::__cxx11::string::~string((string *)&id);
      ::std::__cxx11::string::~string((string *)local_1e0);
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x20));
  return;
}

Assistant:

void CompilerHLSL::emit_atomic(const uint32_t *ops, uint32_t length, spv::Op op)
{
	const char *atomic_op = nullptr;

	string value_expr;
	if (op != OpAtomicIDecrement && op != OpAtomicIIncrement && op != OpAtomicLoad && op != OpAtomicStore)
		value_expr = to_expression(ops[op == OpAtomicCompareExchange ? 6 : 5]);

	bool is_atomic_store = false;

	switch (op)
	{
	case OpAtomicIIncrement:
		atomic_op = "InterlockedAdd";
		value_expr = "1";
		break;

	case OpAtomicIDecrement:
		atomic_op = "InterlockedAdd";
		value_expr = "-1";
		break;

	case OpAtomicLoad:
		atomic_op = "InterlockedAdd";
		value_expr = "0";
		break;

	case OpAtomicISub:
		atomic_op = "InterlockedAdd";
		value_expr = join("-", enclose_expression(value_expr));
		break;

	case OpAtomicSMin:
	case OpAtomicUMin:
		atomic_op = "InterlockedMin";
		break;

	case OpAtomicSMax:
	case OpAtomicUMax:
		atomic_op = "InterlockedMax";
		break;

	case OpAtomicAnd:
		atomic_op = "InterlockedAnd";
		break;

	case OpAtomicOr:
		atomic_op = "InterlockedOr";
		break;

	case OpAtomicXor:
		atomic_op = "InterlockedXor";
		break;

	case OpAtomicIAdd:
		atomic_op = "InterlockedAdd";
		break;

	case OpAtomicExchange:
		atomic_op = "InterlockedExchange";
		break;

	case OpAtomicStore:
		atomic_op = "InterlockedExchange";
		is_atomic_store = true;
		break;

	case OpAtomicCompareExchange:
		if (length < 8)
			SPIRV_CROSS_THROW("Not enough data for opcode.");
		atomic_op = "InterlockedCompareExchange";
		value_expr = join(to_expression(ops[7]), ", ", value_expr);
		break;

	default:
		SPIRV_CROSS_THROW("Unknown atomic opcode.");
	}

	if (is_atomic_store)
	{
		auto &data_type = expression_type(ops[0]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[0]);

		auto &tmp_id = extra_sub_expressions[ops[0]];
		if (!tmp_id)
		{
			tmp_id = ir.increase_bound_by(1);
			emit_uninitialized_temporary_expression(get_pointee_type(data_type).self, tmp_id);
		}

		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_expression(ops[0]), ", ", to_expression(ops[3]), ", ", to_expression(tmp_id),
			          ");");
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			statement(chain->base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
	}
	else
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		forced_temporaries.insert(ops[1]);

		auto &type = get<SPIRType>(result_type);
		statement(variable_decl(type, to_name(id)), ";");

		auto &data_type = expression_type(ops[2]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
		SPIRType::BaseType expr_type;
		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_expression(ops[2]), ", ", value_expr, ", ", to_name(id), ");");
			expr_type = data_type.basetype;
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			expr_type = SPIRType::UInt;
			statement(chain->base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ", value_expr,
			          ", ", to_name(id), ");");
		}

		auto expr = bitcast_expression(type, expr_type, to_name(id));
		set<SPIRExpression>(id, expr, result_type, true);
	}
	flush_all_atomic_capable_variables();
}